

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Native::Log10(BasicValue *__return_storage_ptr__,
                  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  bool bVar1;
  reference this;
  double dVar2;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args_local;
  
  bVar1 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::empty(Args);
  if (bVar1) {
    BasicValue::BasicValue(__return_storage_ptr__,0.0);
  }
  else {
    this = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::front(Args);
    dVar2 = BasicValue::toDouble(this);
    dVar2 = log10(dVar2);
    BasicValue::BasicValue(__return_storage_ptr__,dVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

BasicValue Native::Log10(std::list<BasicValue> &Args) {
  if (Args.empty())
    return 0.0;
  return std::log10(Args.front().toDouble());
}